

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O1

void __thiscall adios2::core::ADIOS::EnterComputationBlock(ADIOS *this)

{
  _Rb_tree_node_base *p_Var1;
  
  this->enteredComputationBlock = true;
  for (p_Var1 = (this->m_IOs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_IOs)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    IO::EnterComputationBlock((IO *)(p_Var1 + 2));
  }
  return;
}

Assistant:

void ADIOS::EnterComputationBlock() noexcept
{
    enteredComputationBlock = true;
    for (auto &ioPair : m_IOs)
    {
        ioPair.second.EnterComputationBlock();
    }
}